

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

void bench_ecmult_0p_g(void *arg,int iters)

{
  int in_ESI;
  int i;
  bench_data *data;
  secp256k1_scalar *in_stack_00000808;
  secp256k1_scalar *in_stack_00000810;
  secp256k1_gej *in_stack_00000818;
  secp256k1_gej *in_stack_00000820;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    secp256k1_ecmult(in_stack_00000820,in_stack_00000818,in_stack_00000810,in_stack_00000808);
  }
  return;
}

Assistant:

static void bench_ecmult_0p_g(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int i;

    for (i = 0; i < iters; ++i) {
        secp256k1_ecmult(&data->output[i], NULL, &secp256k1_scalar_zero, &data->scalars[(data->offset1+i) % POINTS]);
    }
}